

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall
argstest::ArgumentParser::
ParseShort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  size_type *psVar5;
  undefined1 *puVar6;
  _Alloc_hider _Var7;
  char cVar8;
  bool bVar9;
  string value;
  string local_c8;
  string errorMessage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  FlagBase *flag;
  
  std::__cxx11::string::substr((ulong)&argchunk,(ulong)it->_M_current);
  if (argchunk._M_string_length == 0) {
    bVar9 = true;
  }
  else {
    paVar2 = &value.field_2;
    psVar1 = &(this->super_Command).super_Group.super_Base.errorMsg;
    _Var7 = argchunk._M_dataplus;
    do {
      puVar6 = (undefined1 *)((long)&value.field_2 + 8);
      value._M_dataplus._M_p._1_1_ = *_Var7._M_p;
      value._M_dataplus._M_p._0_1_ = 1;
      value.field_2._M_allocated_capacity = 0;
      value.field_2._8_8_ = value.field_2._8_8_ & 0xffffffffffffff00;
      value._M_string_length = (size_type)puVar6;
      iVar3 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&value);
      flag = (FlagBase *)CONCAT44(extraout_var,iVar3);
      if ((undefined1 *)value._M_string_length != puVar6) {
        operator_delete((void *)value._M_string_length);
      }
      if (flag == (FlagBase *)0x0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_c8,'\x01');
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x1d50e7);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          errorMessage.field_2._M_allocated_capacity = *psVar5;
          errorMessage.field_2._8_8_ = plVar4[3];
          errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
        }
        else {
          errorMessage.field_2._M_allocated_capacity = *psVar5;
          errorMessage._M_dataplus._M_p = (pointer)*plVar4;
        }
        errorMessage._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&errorMessage);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          value.field_2._M_allocated_capacity = *psVar5;
          value.field_2._8_8_ = plVar4[3];
          value._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          value.field_2._M_allocated_capacity = *psVar5;
          value._M_dataplus._M_p = (pointer)*plVar4;
        }
        value._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
          operator_delete(errorMessage._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        (this->super_Command).super_Group.super_Base.error = Parse;
        std::__cxx11::string::_M_assign((string *)psVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p != paVar2) {
          operator_delete(value._M_dataplus._M_p);
        }
        bVar9 = false;
        goto LAB_001b5d56;
      }
      _Var7._M_p = _Var7._M_p + 1;
      value._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&value,_Var7._M_p,argchunk._M_dataplus._M_p + argchunk._M_string_length);
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c8,'\x01');
      ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&errorMessage,this,flag,&local_c8,it,end,this->allowSeparateShortValue,
                 this->allowJoinedShortValue,value._M_string_length != 0,&value,
                 value._M_string_length != 0,&values);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (errorMessage._M_string_length == 0) {
        if (this->readCompletion == false) {
          (*(flag->super_NamedBase).super_Base._vptr_Base[0x16])(flag,&values);
        }
        if (((flag->super_NamedBase).super_Base.options & KickOut) == None) {
          cVar8 = (values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                  values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) * '\x02';
        }
        else {
          it->_M_current = it->_M_current + 1;
          cVar8 = '\x01';
        }
      }
      else {
        (this->super_Command).super_Group.super_Base.error = Parse;
        cVar8 = '\x01';
        std::__cxx11::string::_M_assign((string *)psVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
        operator_delete(errorMessage._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&values);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != paVar2) {
        operator_delete(value._M_dataplus._M_p);
      }
      if (cVar8 != '\0') goto LAB_001b5c29;
    } while (_Var7._M_p != argchunk._M_dataplus._M_p + argchunk._M_string_length);
    cVar8 = '\x02';
LAB_001b5c29:
    bVar9 = cVar8 == '\x02';
  }
LAB_001b5d56:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argchunk._M_dataplus._M_p != &argchunk.field_2) {
    operator_delete(argchunk._M_dataplus._M_p);
  }
  return bVar9;
}

Assistant:

bool ParseShort(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(shortprefix.size());
                for (auto argit = std::begin(argchunk); argit != std::end(argchunk); ++argit)
                {
                    const auto arg = *argit;

                    if (auto flag = Match(arg))
                    {
                        const std::string value(argit + 1, std::end(argchunk));
                        std::vector<std::string> values;
                        const std::string errorMessage = ParseArgsValues(*flag, std::string(1, arg), it, end,
                                                                         allowSeparateShortValue, allowJoinedShortValue,
                                                                         !value.empty(), value, !value.empty(), values);

                        if (!errorMessage.empty())
                        {
#ifndef ARGS_NOEXCEPT
                            throw ParseError(errorMessage);
#else
                            error = Error::Parse;
                            errorMsg = errorMessage;
                            return false;
#endif
                        }

                        if (!readCompletion)
                        {
                            flag->ParseValue(values);
                        }

                        if (flag->KickOut())
                        {
                            ++it;
                            return false;
                        }

                        if (!values.empty())
                        {
                            break;
                        }
                    } else
                    {
                        const std::string errorMessage("Flag could not be matched: '" + std::string(1, arg) + "'");
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }
                }

                return true;
            }